

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

void fs_event_unlink_files(uv_timer_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  long *plVar7;
  uv_fs_event_t *puVar8;
  code **ppcVar9;
  int64_t eval_b;
  int64_t eval_a;
  code *apcStack_448 [2];
  char acStack_438 [8];
  uv_fs_event_t auStack_430 [4];
  undefined8 uStack_268;
  long lStack_250;
  char *pcStack_248;
  char acStack_1f8 [440];
  code *pcStack_40;
  undefined8 local_30;
  long local_28;
  
  if (handle == (uv_timer_t *)0x0) {
LAB_00187a5a:
    uVar5 = 0;
    do {
      pcStack_40 = (code *)0x187a89;
      snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-",(ulong)uVar5);
      pcStack_40 = (code *)0x187a91;
      remove(fs_event_filename);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x10);
    return;
  }
  local_28 = (long)fs_event_removed;
  local_30 = 0x10;
  if (local_28 < 0x10) {
    pcStack_40 = (code *)0x1879d5;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    pcStack_40 = (code *)0x1879dd;
    iVar1 = remove(fs_event_filename);
    local_28 = (long)iVar1;
    local_30 = 0;
    if (local_28 == 0) {
      if (0xe < fs_event_removed) {
        fs_event_removed = fs_event_removed + 1;
        return;
      }
      pcStack_40 = (code *)0x187a2f;
      fs_event_removed = fs_event_removed + 1;
      iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
      local_28 = (long)iVar1;
      local_30 = 0;
      if (local_28 == 0) {
        return;
      }
      pcStack_40 = (code *)0x187a5a;
      fs_event_unlink_files_cold_3();
      goto LAB_00187a5a;
    }
  }
  else {
    pcStack_40 = (code *)0x187ab2;
    fs_event_unlink_files_cold_1();
  }
  plVar7 = &local_28;
  pcStack_40 = create_dir;
  fs_event_unlink_files_cold_2();
  pcVar6 = acStack_1f8;
  puVar8 = (uv_fs_event_t *)0x0;
  iVar3 = 0x1ed;
  iVar1 = uv_fs_mkdir(0,pcVar6,plVar7,0x1ed,0);
  if ((iVar1 == -0x11) || (iVar1 == 0)) {
    uv_fs_req_cleanup(acStack_1f8);
    return;
  }
  create_dir_cold_1();
  uVar5 = fs_event_cb_called + 1;
  pcVar4 = (char *)(ulong)uVar5;
  fs_event_cb_called = uVar5;
  if (puVar8 == &fs_event) {
    if (iVar3 != 0) goto LAB_00187c0d;
    if (1 < extraout_EDX - 1U) goto LAB_00187c1a;
    iVar1 = strncmp(pcVar6,"fsevent-",8);
    if (iVar1 == 0) {
      if (fs_event_removed + fs_event_created == 0x10) {
        iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        if (iVar1 == 0) {
          return;
        }
        fs_event_cb_dir_multi_file_cold_5();
      }
      if (uVar5 != 0x20) {
        return;
      }
      uv_close(&timer,close_cb);
      uv_close(&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_multi_file_cold_1();
LAB_00187c0d:
    fs_event_cb_dir_multi_file_cold_2();
LAB_00187c1a:
    fs_event_cb_dir_multi_file_cold_3();
  }
  fs_event_cb_dir_multi_file_cold_4();
  if (fs_event_created < 0x10) {
    pcVar4 = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_248 = pcVar4;
  uVar2 = uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(uVar2,&fs_event);
  lStack_250 = (long)iVar1;
  if (lStack_250 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    lStack_250 = (long)iVar1;
    if (lStack_250 != 0) goto LAB_00187efc;
    iVar1 = uv_timer_init(uVar2,&timer);
    lStack_250 = (long)iVar1;
    if (lStack_250 != 0) goto LAB_00187f09;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    lStack_250 = (long)iVar1;
    if (lStack_250 != 0) goto LAB_00187f16;
    uv_run(uVar2,0);
    lStack_250 = 1;
    if (fs_event_cb_called != 1) goto LAB_00187f23;
    lStack_250 = 2;
    if (timer_cb_called != 2) goto LAB_00187f30;
    lStack_250 = 2;
    if (close_cb_called != 2) goto LAB_00187f3d;
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    lStack_250 = 0;
    iVar1 = uv_loop_close(uVar2);
    if (lStack_250 == iVar1) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_watch_file_cold_1();
LAB_00187efc:
    run_test_fs_event_watch_file_cold_2();
LAB_00187f09:
    run_test_fs_event_watch_file_cold_3();
LAB_00187f16:
    run_test_fs_event_watch_file_cold_4();
LAB_00187f23:
    run_test_fs_event_watch_file_cold_5();
LAB_00187f30:
    run_test_fs_event_watch_file_cold_6();
LAB_00187f3d:
    run_test_fs_event_watch_file_cold_7();
  }
  plVar7 = &lStack_250;
  run_test_fs_event_watch_file_cold_8();
  iVar3 = 0x41;
  apcStack_448[0] = (code *)0x187f7d;
  uStack_268 = uVar2;
  iVar1 = uv_fs_open(0,&auStack_430[0].loop,plVar7,0x41,0x180,0);
  auStack_430[0].data = (void *)(long)iVar1;
  acStack_438[0] = '\0';
  acStack_438[1] = '\0';
  acStack_438[2] = '\0';
  acStack_438[3] = '\0';
  acStack_438[4] = '\0';
  acStack_438[5] = '\0';
  acStack_438[6] = '\0';
  acStack_438[7] = '\0';
  if (auStack_430[0].data == (void *)0x0) {
    apcStack_448[0] = (code *)0x187fa9;
    uv_fs_req_cleanup(&auStack_430[0].loop);
    iVar3 = 0;
    apcStack_448[0] = (code *)0x187fb7;
    iVar1 = uv_fs_close(0,&auStack_430[0].loop,auStack_430[0].wd);
    auStack_430[0].data = (void *)(long)iVar1;
    acStack_438[0] = '\0';
    acStack_438[1] = '\0';
    acStack_438[2] = '\0';
    acStack_438[3] = '\0';
    acStack_438[4] = '\0';
    acStack_438[5] = '\0';
    acStack_438[6] = '\0';
    acStack_438[7] = '\0';
    if (auStack_430[0].data == (void *)0x0) {
      apcStack_448[0] = (code *)0x187fdd;
      uv_fs_req_cleanup(&auStack_430[0].loop);
      return;
    }
  }
  else {
    apcStack_448[0] = (code *)0x187ff6;
    create_file_cold_1();
  }
  puVar8 = auStack_430;
  pcVar6 = acStack_438;
  apcStack_448[0] = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar8 == &fs_event) {
    apcStack_448[0] = (code *)(long)iVar3;
    if (apcStack_448[0] != (code *)0x0) goto LAB_001880d3;
    apcStack_448[0] = (code *)(long)extraout_EDX_00;
    if (apcStack_448[0] != (code *)0x2) goto LAB_001880e2;
    iVar1 = strcmp(pcVar6,"file2");
    apcStack_448[0] = (code *)(long)iVar1;
    if (apcStack_448[0] == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      apcStack_448[0] = (code *)(long)iVar1;
      if (apcStack_448[0] == (code *)0x0) {
        uv_close(&fs_event,close_cb);
        return;
      }
      goto LAB_00188100;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_001880d3:
    fs_event_cb_file_cold_2();
LAB_001880e2:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00188100:
  ppcVar9 = apcStack_448;
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close(ppcVar9,close_cb);
  return;
}

Assistant:

static void fs_event_unlink_files(uv_timer_t* handle) {
  int r;
  int i;

  /* NOTE: handle might be NULL if invoked not as timer callback */
  if (handle == NULL) {
    /* Unlink all files */
    for (i = 0; i < 16; i++) {
      r = remove(fs_event_get_filename(i));
      if (handle != NULL)
        ASSERT_OK(r);
    }
  } else {
    /* Make sure we're not attempting to remove files we do not intend */
    ASSERT_LT(fs_event_removed, fs_event_file_count);

    /* Remove the file */
    ASSERT_OK(remove(fs_event_get_filename(fs_event_removed)));

    if (++fs_event_removed < fs_event_file_count) {
      /* Remove another file on a different event loop tick.  We do it this way
       * to avoid fs events coalescing into one fs event. */
      ASSERT_OK(uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
    }
  }
}